

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_common.c
# Opt level: O1

_Bool tree_iterator_prevn(void *Iterator,size_t count)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  lVar2 = *(long *)((long)Iterator + 8);
  if (count != 0 && lVar2 != 0) {
    do {
      lVar1 = *(long *)(lVar2 + 0x18);
      lVar3 = lVar2;
      if (*(long *)(lVar2 + 0x18) == 0) {
        do {
          lVar2 = *(long *)(lVar3 + 0x10);
          if (lVar2 == 0) break;
          bVar4 = *(long *)(lVar2 + 0x18) == lVar3;
          lVar3 = lVar2;
        } while (bVar4);
      }
      else {
        do {
          lVar2 = lVar1;
          lVar1 = *(long *)(lVar2 + 0x20);
        } while (*(long *)(lVar2 + 0x20) != 0);
      }
    } while ((lVar2 != 0) && (count = count - 1, count != 0));
    *(long *)((long)Iterator + 8) = lVar2;
  }
  return lVar2 != 0;
}

Assistant:

bool
tree_iterator_prevn(void* Iterator, size_t count)
{
    tree_iterator* iterator = Iterator;
    while (iterator->node && count--)
	iterator->node = tree_node_prev(iterator->node);
    return iterator->node != NULL;
}